

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateReplayer::Impl::parse_descriptor_set_layouts
          (Impl *this,StateCreatorInterface *iface,DatabaseInterface *resolver,Value *layouts)

{
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_00;
  uint64_t uVar1;
  VkDescriptorSetLayoutCreateInfo *pVVar2;
  bool bVar3;
  SizeType SVar4;
  uint uVar5;
  int iVar6;
  ConstMemberIterator this_01;
  ConstMemberIterator CVar7;
  Ch *str;
  size_type sVar8;
  Type pGVar9;
  mapped_type *ppVVar10;
  ulong uVar11;
  ulong uVar12;
  Hash hash;
  uint64_t local_70;
  StateCreatorInterface *local_68;
  VkDescriptorSetLayoutCreateInfo *local_60;
  Impl *local_58;
  DatabaseInterface *local_50;
  VkDescriptorSetLayoutCreateInfo *local_48;
  ulong local_40;
  Value *local_38;
  
  local_68 = iface;
  local_50 = resolver;
  SVar4 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::MemberCount(layouts);
  local_48 = ScratchAllocator::allocate_n_cleared<VkDescriptorSetLayoutCreateInfo>
                       (&this->allocator,(ulong)SVar4);
  local_38 = layouts;
  this_01 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::MemberBegin(layouts);
  uVar11 = 0;
  local_58 = this;
  while( true ) {
    CVar7 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::MemberEnd(local_38);
    if (this_01.ptr_ == CVar7.ptr_) break;
    str = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetString(&(this_01.ptr_)->name);
    local_70 = string_to_uint64(str);
    sVar8 = std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkDescriptorSetLayout_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkDescriptorSetLayout_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::count(&(this->replayed_descriptor_set_layouts)._M_h,&local_70);
    pVVar2 = local_48;
    uVar12 = uVar11;
    if (sVar8 == 0) {
      this_00 = &(this_01.ptr_)->value;
      local_60 = local_48 + uVar11;
      local_48[uVar11].sType = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO;
      local_40 = uVar11;
      pGVar9 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)this_00,"flags");
      uVar5 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::GetUint(pGVar9);
      uVar12 = local_40;
      pVVar2[uVar11].flags = uVar5;
      bVar3 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::HasMember(this_00,"bindings");
      if (bVar3) {
        pGVar9 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)this_00,"bindings");
        SVar4 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::Size(pGVar9);
        local_60->bindingCount = SVar4;
        bVar3 = parse_descriptor_set_bindings
                          (local_58,local_68,local_50,pGVar9,&local_60->pBindings);
        if (!bVar3) goto LAB_0010deff;
      }
      bVar3 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::HasMember(this_00,"pNext");
      if (bVar3) {
        pGVar9 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)this_00,"pNext");
        bVar3 = parse_pnext_chain(local_58,pGVar9,&local_60->pNext,(StateCreatorInterface *)0x0,
                                  (DatabaseInterface *)0x0,(Value *)0x0);
        if (!bVar3) goto LAB_0010deff;
      }
      uVar1 = local_70;
      ppVVar10 = std::__detail::
                 _Map_base<unsigned_long,_std::pair<const_unsigned_long,_VkDescriptorSetLayout_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkDescriptorSetLayout_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_VkDescriptorSetLayout_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkDescriptorSetLayout_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&this->replayed_descriptor_set_layouts,&local_70);
      iVar6 = (*local_68->_vptr_StateCreatorInterface[6])(local_68,uVar1,local_60,ppVVar10);
      if ((char)iVar6 == '\0') goto LAB_0010deff;
    }
    this_01.ptr_ = this_01.ptr_ + 1;
    uVar11 = (ulong)((int)uVar12 + 1);
  }
  (*local_68->_vptr_StateCreatorInterface[0x11])();
LAB_0010deff:
  return this_01.ptr_ == CVar7.ptr_;
}

Assistant:

bool StateReplayer::Impl::parse_descriptor_set_layouts(StateCreatorInterface &iface, DatabaseInterface *resolver, const Value &layouts)
{
	auto *infos = allocator.allocate_n_cleared<VkDescriptorSetLayoutCreateInfo>(layouts.MemberCount());

	unsigned index = 0;
	for (auto itr = layouts.MemberBegin(); itr != layouts.MemberEnd(); ++itr, index++)
	{
		Hash hash = string_to_uint64(itr->name.GetString());
		if (replayed_descriptor_set_layouts.count(hash))
			continue;
		auto &obj = itr->value;
		auto &info = infos[index];
		info.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO;

		info.flags = obj["flags"].GetUint();
		if (obj.HasMember("bindings"))
		{
			auto &bindings = obj["bindings"];
			info.bindingCount = bindings.Size();
			if (!parse_descriptor_set_bindings(iface, resolver, bindings, &info.pBindings))
				return false;
		}

		if (obj.HasMember("pNext"))
			if (!parse_pnext_chain(obj["pNext"], &info.pNext))
				return false;

		if (!iface.enqueue_create_descriptor_set_layout(hash, &info, &replayed_descriptor_set_layouts[hash]))
			return false;
	}

	iface.notify_replayed_resources_for_type();
	return true;
}